

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O0

double __thiscall NetworkNS::RanMars::rand_gauss(RanMars *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double s;
  double v2;
  double v1;
  RanMars *this_local;
  
  do {
    dVar1 = uniform(this);
    dVar1 = dVar1 + dVar1 + -1.0;
    dVar2 = uniform(this);
    dVar2 = dVar2 + dVar2 + -1.0;
    dVar2 = dVar1 * dVar1 + dVar2 * dVar2;
  } while (1.0 <= dVar2);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar3 = log(dVar2);
    dVar2 = sqrt((dVar3 * -2.0) / dVar2);
    this_local = (RanMars *)(dVar1 * dVar2);
  }
  else {
    this_local = (RanMars *)0x0;
  }
  return (double)this_local;
}

Assistant:

double RanMars::rand_gauss(void) {
      double v1, v2, s;

      do {
         v1 = 2.0 * uniform() - 1;
         v2 = 2.0 * uniform() - 1;

         s = v1 * v1 + v2*v2;
      } while (s >= 1.0);

      if (s == 0.0)
         return 0.0;
      else
         return (v1 * sqrt(-2.0 * log(s) / s));
   }